

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

void * prf_array_insert_ptr(void *id,int idx,void *elem)

{
  array *paVar1;
  void *pvVar2;
  void *in_RDX;
  int in_ESI;
  void *in_RDI;
  void **ptr;
  int n;
  int i;
  uint local_1c;
  undefined4 in_stack_fffffffffffffff0;
  
  paVar1 = id_to_array(in_RDI);
  local_1c = *(uint *)&paVar1->field_0x4 >> 4;
  pvVar2 = prf_array_append_ptr((void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
  if (in_ESI < (int)local_1c) {
    for (; in_ESI < (int)local_1c; local_1c = local_1c - 1) {
      *(undefined8 *)((long)pvVar2 + (long)(int)local_1c * 8) =
           *(undefined8 *)((long)pvVar2 + (long)(int)(local_1c - 1) * 8);
    }
    *(void **)((long)pvVar2 + (long)in_ESI * 8) = in_RDX;
  }
  return pvVar2;
}

Assistant:

void *
prf_array_insert_ptr(void *id, int idx, void *elem)
{
  int i, n;
  void **ptr;

  n = id_to_array(id)->numelem;

  /* make room for one more */
  ptr = (void**)prf_array_append_ptr(id, elem);

  if (idx < n) {
    for (i = n; i > idx; i--) {
      ptr[i] = ptr[i-1]; 
    }
    ptr[idx] = elem;
  }
  return ptr;
}